

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

bool __thiscall Clasp::ClaspConfig::Impl::addPost(Impl *this,Solver *s,SolverParams *opts)

{
  bool bVar1;
  bool bVar2;
  DefaultUnfoundedCheck *pDVar3;
  AcyclicityCheck *this_00;
  ulong uVar4;
  ulong uVar5;
  pointer pCVar6;
  pointer this_01;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  
  if (s->shared_ == (SharedContext *)0x0) {
    Potassco::fail(-1,"bool Clasp::ClaspConfig::Impl::addPost(Solver &, const SolverParams &)",0x6d,
                   "s.sharedContext() != 0","Solver not attached!",0);
  }
  if ((s->shared_->sccGraph).ptr_ < 2) {
LAB_001189e7:
    if (1 < (s->shared_->extGraph).ptr_) {
      local_40._M_device = &this->mutex;
      local_40._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_40);
      local_40._M_owns = true;
      do {
        uVar5 = this->acycSet;
        uVar4 = 1L << (SUB81(s->strategy_,7) >> 2);
        if ((uVar5 >> ((ulong)s->strategy_ >> 0x3a) & 1) == 0) {
          this->acycSet = uVar4 | uVar5;
        }
        std::unique_lock<std::mutex>::unlock(&local_40);
      } while (local_40._M_owns != false);
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      if ((uVar4 & uVar5) == 0) {
        this_00 = (AcyclicityCheck *)operator_new(0x90);
        AcyclicityCheck::AcyclicityCheck
                  (this_00,(DependencyGraph *)((s->shared_->extGraph).ptr_ & 0xfffffffffffffffe));
        bVar1 = Solver::addPost(s,(PostPropagator *)this_00);
        if (!bVar1) goto LAB_00118afa;
      }
    }
    uVar5 = (ulong)(this->pp).ebo_.size;
    bVar1 = true;
    if (uVar5 != 0) {
      this_01 = (this->pp).ebo_.buf;
      pCVar6 = this_01 + uVar5;
      do {
        local_40._M_owns = false;
        local_40._M_device = &this->mutex;
        std::unique_lock<std::mutex>::lock(&local_40);
        local_40._M_owns = true;
        while (local_40._M_owns == true) {
          bVar2 = ConfiguratorProxy::applyConfig(this_01,s);
          if (!bVar2) {
            std::unique_lock<std::mutex>::~unique_lock(&local_40);
            goto LAB_00118afa;
          }
          std::unique_lock<std::mutex>::unlock(&local_40);
        }
        std::unique_lock<std::mutex>::~unique_lock(&local_40);
        this_01 = this_01 + 1;
      } while (this_01 != pCVar6);
    }
  }
  else {
    pDVar3 = (DefaultUnfoundedCheck *)Solver::getPost(s,10);
    if (pDVar3 != (DefaultUnfoundedCheck *)0x0) {
      DefaultUnfoundedCheck::setReasonStrategy
                (pDVar3,*(uint *)&opts->field_0x18 >> 0x12 & shared_reason);
      goto LAB_001189e7;
    }
    pDVar3 = (DefaultUnfoundedCheck *)operator_new(0xf8);
    DefaultUnfoundedCheck::DefaultUnfoundedCheck
              (pDVar3,(DependencyGraph *)((s->shared_->sccGraph).ptr_ & 0xfffffffffffffffe),
               *(uint *)&opts->field_0x18 >> 0x12 & shared_reason);
    bVar1 = Solver::addPost(s,(PostPropagator *)pDVar3);
    if (bVar1) goto LAB_001189e7;
LAB_00118afa:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

void ClaspConfig::Impl::prepare(SharedContext& ctx) {
	if (ctx.concurrency() < 64) {
		acycSet &= (bit_mask<uint64>(ctx.concurrency()) - 1);
	}
	for (PPVec::iterator it = pp.begin(), end = pp.end(); it != end; ++it) {
		it->prepare(ctx);
	}
}